

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O0

void duckdb::EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *in_RDX;
  undefined8 in_RSI;
  DataChunk *in_RDI;
  Vector intermediate_result;
  value_type *nice_rounding;
  value_type *bin_count;
  value_type *max_arg;
  value_type *min_arg;
  size_type in_stack_fffffffffffffed8;
  undefined1 strict;
  Vector *in_stack_fffffffffffffee0;
  Vector *in_stack_fffffffffffffee8;
  reference d;
  undefined8 in_stack_fffffffffffffef8;
  LogicalTypeId id;
  reference c;
  LogicalType *in_stack_ffffffffffffff00;
  Vector *b;
  Vector *a;
  anon_class_8_1_a8a4b3b1 fun;
  LogicalType *in_stack_ffffffffffffff18;
  Vector *in_stack_ffffffffffffff20;
  LogicalType *in_stack_ffffffffffffff28;
  undefined1 local_d0 [168];
  reference local_28;
  reference local_20;
  Vector *local_18;
  undefined1 uStack_9;
  DataChunk *local_8;
  
  uStack_9 = (undefined1)((ulong)in_RSI >> 0x38);
  id = (LogicalTypeId)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8);
  local_d0._160_8_ =
       vector<duckdb::Vector,_true>::operator[]
                 ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffed8);
  local_d0._152_8_ =
       vector<duckdb::Vector,_true>::operator[]
                 ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffee0,
                  in_stack_fffffffffffffed8);
  fun.state = (ExpressionState *)local_d0;
  LogicalType::LogicalType(in_stack_ffffffffffffff00,id);
  LogicalType::LIST(in_stack_ffffffffffffff28);
  Vector::Vector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(idx_t)fun.state);
  LogicalType::~LogicalType((LogicalType *)0x2003eae);
  LogicalType::~LogicalType((LogicalType *)0x2003eb8);
  d = local_20;
  c = local_28;
  b = (Vector *)local_d0._160_8_;
  a = (Vector *)local_d0._152_8_;
  DataChunk::size(local_8);
  strict = uStack_9;
  GenericExecutor::
  ExecuteQuaternary<duckdb::PrimitiveType<double>,duckdb::PrimitiveType<double>,duckdb::PrimitiveType<long>,duckdb::PrimitiveType<bool>,duckdb::GenericListType<duckdb::PrimitiveType<double>>,duckdb::EquiWidthBinFunction<double,duckdb::EquiWidthBinsDouble>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::PrimitiveType<double>,duckdb::PrimitiveType<double>,duckdb::PrimitiveType<long>,duckdb::PrimitiveType<bool>)_1_>
            (a,b,c,d,in_stack_fffffffffffffee8,(idx_t)in_stack_fffffffffffffee0,fun);
  DataChunk::size(local_8);
  VectorOperations::DefaultCast(d,local_18,(idx_t)in_stack_fffffffffffffee0,(bool)strict);
  Vector::~Vector(in_stack_fffffffffffffee0);
  return;
}

Assistant:

static void EquiWidthBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	static constexpr int64_t MAX_BIN_COUNT = 1000000;
	auto &min_arg = args.data[0];
	auto &max_arg = args.data[1];
	auto &bin_count = args.data[2];
	auto &nice_rounding = args.data[3];

	Vector intermediate_result(LogicalType::LIST(OP::LOGICAL_TYPE));
	GenericExecutor::ExecuteQuaternary<PrimitiveType<T>, PrimitiveType<T>, PrimitiveType<int64_t>, PrimitiveType<bool>,
	                                   GenericListType<PrimitiveType<T>>>(
	    min_arg, max_arg, bin_count, nice_rounding, intermediate_result, args.size(),
	    [&](PrimitiveType<T> min_p, PrimitiveType<T> max_p, PrimitiveType<int64_t> bins_p,
	        PrimitiveType<bool> nice_rounding_p) {
		    if (max_p.val < min_p.val) {
			    throw InvalidInputException(state.expr,
			                                "Invalid input for bin function - max value is smaller than min value");
		    }
		    if (bins_p.val <= 0) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - there must be > 0 bins");
		    }
		    if (bins_p.val > MAX_BIN_COUNT) {
			    throw InvalidInputException(state.expr, "Invalid input for bin function - max bin count of %d exceeded",
			                                MAX_BIN_COUNT);
		    }
		    GenericListType<PrimitiveType<T>> result_bins;
		    if (max_p.val == min_p.val) {
			    // if max = min return a single bucket
			    result_bins.values.push_back(max_p.val);
		    } else {
			    result_bins.values = OP::Operation(state.expr, min_p.val, max_p.val, static_cast<idx_t>(bins_p.val),
			                                       nice_rounding_p.val);
			    // last bin should always be the input max
			    if (result_bins.values[0].val < max_p.val) {
				    result_bins.values[0].val = max_p.val;
			    }
			    std::reverse(result_bins.values.begin(), result_bins.values.end());
		    }
		    return result_bins;
	    });
	VectorOperations::DefaultCast(intermediate_result, result, args.size());
}